

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O1

int dmrC_lookup_type(token *token)

{
  symbol *psVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (((ulong)token->pos & 0x3f) == 2) {
    psVar1 = dmrC_lookup_symbol((token->field_2).ident,NS_SYMBOL|NS_TYPEDEF);
    uVar2 = 0;
    if (psVar1 != (symbol *)0x0) {
      uVar2 = *(uint *)psVar1 >> 9 & 1;
    }
  }
  return uVar2;
}

Assistant:

static inline int dmrC_lookup_type(struct token *token)
{
	if (token->pos.type == TOKEN_IDENT) {
		struct symbol *sym = dmrC_lookup_symbol(
		    token->ident,
		    (enum namespace_type)(NS_SYMBOL | NS_TYPEDEF));
		return sym && (sym->ns & NS_TYPEDEF);
	}
	return 0;
}